

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
min_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(min_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_type i_00;
  unsigned_long *puVar4;
  const_reference this_00;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar5;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  value_type vVar7;
  size_t i;
  size_t index;
  bool is_string;
  bool is_number;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff08;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff10;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff18;
  jsonpath_errc __e;
  error_code *in_stack_ffffffffffffff20;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff28;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff98;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this_01;
  
  pbVar8 = in_RDI;
  i_00 = std::
         vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         ::size(in_RDX);
  function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::arity(in_RSI);
  puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x6d8b52);
  if (i_00 == *puVar4) {
    this_00 = std::
              vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              ::operator[](in_RDX,0);
    parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::value(this_00);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                      (in_stack_ffffffffffffff28);
    if (bVar1) {
      bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::empty
                        (pbVar8);
      if (bVar1) {
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      else {
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                  (in_stack_ffffffffffffff98,i_00);
        bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_number(in_stack_ffffffffffffff28);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                  (in_stack_ffffffffffffff98,i_00);
        bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_string(in_stack_ffffffffffffff28);
        if ((bVar1) || (bVar2)) {
          pbVar8 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x1
          ;
          while( true ) {
            this_01 = pbVar8;
            pbVar5 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     size(in_stack_ffffffffffffff18);
            __e = (jsonpath_errc)((ulong)in_stack_ffffffffffffff18 >> 0x20);
            if (pbVar5 <= pbVar8) break;
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                      (this_01,i_00);
            bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                    is_number(in_stack_ffffffffffffff28);
            if (bVar3 != bVar1) {
LAB_006d8dd5:
              std::error_code::operator=(in_stack_ffffffffffffff20,__e);
              basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
              basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                        (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
              goto LAB_006d8ec4;
            }
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                      (this_01,i_00);
            bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                    is_string(in_stack_ffffffffffffff28);
            if (bVar3 != bVar2) goto LAB_006d8dd5;
            in_stack_ffffffffffffff20 =
                 (error_code *)
                 basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (this_01,i_00);
            in_stack_ffffffffffffff18 =
                 basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (this_01,i_00);
            jsoncons::operator<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            pbVar8 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     ((long)&this_01->field_0 + 1);
          }
          pbVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                             (this_01,i_00);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                    (pbVar8,in_stack_ffffffffffffff08);
        }
        else {
          std::error_code::operator=
                    (in_stack_ffffffffffffff20,
                     (jsonpath_errc)((ulong)in_stack_ffffffffffffff18 >> 0x20));
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
      }
    }
    else {
      std::error_code::operator=
                (in_stack_ffffffffffffff20,(jsonpath_errc)((ulong)in_stack_ffffffffffffff18 >> 0x20)
                );
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
LAB_006d8ec4:
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               0x6d8ed1);
    uVar6 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=
              (in_stack_ffffffffffffff20,(jsonpath_errc)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    uVar6 = extraout_RDX;
  }
  vVar7.field_0.int64_.val_ = uVar6;
  vVar7.field_0._0_8_ = in_RDI;
  return (value_type)vVar7.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_array())
            {
                //std::cout << "arg: " << arg0 << "\n";
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            if (arg0.empty())
            {
                return value_type::null();
            }
            bool is_number = arg0.at(0).is_number();
            bool is_string = arg0.at(0).is_string();
            if (!is_number && !is_string)
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            std::size_t index = 0;
            for (std::size_t i = 1; i < arg0.size(); ++i)
            {
                if (!(arg0.at(i).is_number() == is_number && arg0.at(i).is_string() == is_string))
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
                if (arg0.at(i) < arg0.at(index))
                {
                    index = i;
                }
            }

            return arg0.at(index);
        }